

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::WildcardPattern::normaliseString(WildcardPattern *this,string *str)

{
  string *in_RDX;
  int *in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffffc8;
  
  if (*in_RSI == 1) {
    toLower(in_stack_ffffffffffffffc8);
  }
  else {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,in_RDX);
  }
  trim(in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_RDI;
}

Assistant:

std::string WildcardPattern::normaliseString( std::string const& str ) const {
        return trim( m_caseSensitivity == CaseSensitive::No ? toLower( str ) : str );
    }